

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_mapper.h
# Opt level: O2

void UxROM_init(nes_cartridge *cartridge)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  
  uVar1 = cartridge->prg_rom_size;
  plVar2 = (long *)cartridge->mapper_state;
  lVar3 = (uVar1 & 0xffffffffffffc000) - 0x4000;
  plVar2[1] = lVar3;
  *plVar2 = lVar3;
  *(byte *)(plVar2 + 2) = (0x3ffff < uVar1) << 3 | 7;
  return;
}

Assistant:

static void UxROM_init(nes_cartridge* cartridge)
{
    const size_t bank_size = 16 * 1024;
    uxrom_mapper_state* state = (uxrom_mapper_state*)cartridge->mapper_state;
    size_t num_banks = cartridge->prg_rom_size / bank_size;
    state->fixed_bank_offset = (num_banks - 1) * bank_size; 
    state->current_bank_offset = state->fixed_bank_offset;
    if (num_banks < 16)
        state->bank_mask = 0x07;
    else
        state->bank_mask = 0x0F;
}